

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O1

QString * Mustache::Renderer::readTagName
                    (QString *__return_storage_ptr__,QString *content,int pos,int endPos)

{
  ArrayOptions *pAVar1;
  char16_t cVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  char cVar5;
  AllocationOption AVar6;
  long lVar7;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  AVar6 = Grow;
  if (0 < endPos - pos) {
    AVar6 = endPos - pos;
  }
  QString::reallocData((longlong)__return_storage_ptr__,AVar6);
  pDVar3 = (__return_storage_ptr__->d).d;
  if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar3->super_QArrayData).flags;
    *(byte *)&pAVar1->i = (byte)pAVar1->i | 1;
  }
  pcVar4 = (content->d).ptr;
  lVar7 = (long)pos;
  do {
    cVar2 = pcVar4[lVar7];
    if ((4 < (ushort)cVar2 - 9) && (cVar2 != L' ')) {
      if ((ushort)cVar2 < 0x80) {
LAB_00117f80:
        while( true ) {
          cVar2 = (content->d).ptr[lVar7];
          if ((0x17 < (ushort)((ushort)cVar2 - 9)) ||
             (cVar5 = '\x01', (0x80001fU >> ((ushort)cVar2 - 9 & 0x1f) & 1) == 0)) {
            if ((ushort)cVar2 < 0x80) {
              cVar5 = '\0';
            }
            else {
              cVar5 = '\x01';
              if ((cVar2 != L'\x85') && ((uint)(ushort)cVar2 != L'\xa0')) {
                cVar5 = QChar::isSpace_helper((uint)(ushort)cVar2);
              }
            }
          }
          if ((endPos <= lVar7) || (cVar5 != '\0')) break;
          QString::append((QChar)(char16_t)__return_storage_ptr__);
          lVar7 = lVar7 + 1;
        }
        return __return_storage_ptr__;
      }
      if ((cVar2 != L'\x85') && ((uint)(ushort)cVar2 != L'\xa0')) {
        cVar5 = QChar::isSpace_helper((uint)(ushort)cVar2);
        if (cVar5 == '\0') goto LAB_00117f80;
      }
    }
    lVar7 = lVar7 + 1;
  } while( true );
}

Assistant:

QString Renderer::readTagName(const QString& content, int pos, int endPos)
{
	QString name;
	name.reserve(endPos - pos);
	while (content.at(pos).isSpace()) {
		++pos;
	}
	while (!content.at(pos).isSpace() && pos < endPos) {
		name += content.at(pos);
		++pos;
	}
	return name;
}